

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O1

int hostkey_method_ssh_ecdsa_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  EVP_PKEY *ec_ctx;
  libssh2_curve_type lVar1;
  int iVar2;
  size_t hash_len;
  long lVar3;
  EVP_MD_CTX *ctx;
  uchar hash [32];
  EVP_MD_CTX *pEStack_98;
  uchar **local_90;
  size_t *local_88;
  LIBSSH2_SESSION *local_80;
  uchar local_78 [72];
  
  ec_ctx = (EVP_PKEY *)*abstract;
  local_80 = session;
  lVar1 = _libssh2_ecdsa_get_curve_type(ec_ctx);
  local_90 = signature;
  local_88 = signature_len;
  if (lVar1 == LIBSSH2_EC_CURVE_NISTP521) {
    iVar2 = _libssh2_sha512_init(&pEStack_98);
    if (iVar2 == 0) {
      return -1;
    }
    if (0 < veccount) {
      lVar3 = 0;
      do {
        iVar2 = _libssh2_sha512_update
                          (&pEStack_98,*(void **)((long)&datavec->iov_base + lVar3),
                           *(size_t *)((long)&datavec->iov_len + lVar3));
        if (iVar2 == 0) {
          return -1;
        }
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)veccount << 4 != lVar3);
    }
    iVar2 = _libssh2_sha512_final(&pEStack_98,local_78);
    if (iVar2 == 0) {
      return -1;
    }
    hash_len = 0x40;
  }
  else if (lVar1 == LIBSSH2_EC_CURVE_NISTP384) {
    iVar2 = _libssh2_sha384_init(&pEStack_98);
    if (iVar2 == 0) {
      return -1;
    }
    if (0 < veccount) {
      lVar3 = 0;
      do {
        iVar2 = _libssh2_sha384_update
                          (&pEStack_98,*(void **)((long)&datavec->iov_base + lVar3),
                           *(size_t *)((long)&datavec->iov_len + lVar3));
        if (iVar2 == 0) {
          return -1;
        }
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)veccount << 4 != lVar3);
    }
    iVar2 = _libssh2_sha384_final(&pEStack_98,local_78);
    if (iVar2 == 0) {
      return -1;
    }
    hash_len = 0x30;
  }
  else {
    if (lVar1 != LIBSSH2_EC_CURVE_NISTP256) {
      return -1;
    }
    iVar2 = _libssh2_sha256_init(&pEStack_98);
    if (iVar2 == 0) {
      return -1;
    }
    if (0 < veccount) {
      lVar3 = 0;
      do {
        iVar2 = _libssh2_sha256_update
                          (&pEStack_98,*(void **)((long)&datavec->iov_base + lVar3),
                           *(size_t *)((long)&datavec->iov_len + lVar3));
        if (iVar2 == 0) {
          return -1;
        }
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)veccount << 4 != lVar3);
    }
    iVar2 = _libssh2_sha256_final(&pEStack_98,local_78);
    if (iVar2 == 0) {
      return -1;
    }
    hash_len = 0x20;
  }
  iVar2 = _libssh2_ecdsa_sign(local_80,ec_ctx,local_78,hash_len,local_90,local_88);
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_signv(LIBSSH2_SESSION * session,
                               unsigned char **signature,
                               size_t *signature_len,
                               int veccount,
                               const struct iovec datavec[],
                               void **abstract)
{
    libssh2_ecdsa_ctx *ec_ctx = (libssh2_ecdsa_ctx *) (*abstract);
    libssh2_curve_type type = _libssh2_ecdsa_get_curve_type(ec_ctx);
    int ret = 0;

    if(type == LIBSSH2_EC_CURVE_NISTP256) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(256);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP384) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(384);
    }
    else if(type == LIBSSH2_EC_CURVE_NISTP521) {
        LIBSSH2_HOSTKEY_METHOD_EC_SIGNV_HASH(512);
    }
    else {
        return -1;
    }

    return ret;
}